

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O0

SiameseResult __thiscall
siamese::Encoder::GenerateSinglePacket(Encoder *this,SiameseRecoveryPacket *packet)

{
  byte bVar1;
  bool bVar2;
  uint8_t uVar3;
  uint *in_RSI;
  long in_RDI;
  uint footerBytes;
  RecoveryMetadata metadata;
  uint originalBytes;
  OriginalPacket *original;
  uint bytes;
  LogStringBuffer buffer;
  char *in_stack_fffffffffffff928;
  Allocator *in_stack_fffffffffffff930;
  GrowingAlignedDataBuffer *in_stack_fffffffffffff938;
  LogStringBuffer *pLVar4;
  LogStringBuffer *buffer_00;
  OutputWorker *this_00;
  uint local_67c;
  uint local_678 [4];
  reference local_668;
  uint *local_660;
  SiameseResult local_650;
  uint local_64c;
  long local_648;
  int local_63c;
  uint8_t *local_638;
  uint *local_630;
  uint *local_628;
  char *local_620;
  uint *local_618;
  char *local_610;
  uint *local_608;
  char *local_600;
  uint *local_5f8;
  char *local_5f0;
  undefined8 *local_5e8;
  uint local_5dc;
  long local_5d8;
  uint8_t *local_5c0;
  undefined4 local_5b8;
  undefined4 local_5b4;
  uint8_t *local_5b0;
  uint local_5a8;
  uint local_5a4;
  uint *local_5a0;
  char *local_598;
  uint *local_590;
  char *local_588;
  uint *local_580;
  char *local_578;
  uint *local_570;
  char *local_568;
  undefined4 local_55c;
  undefined8 *local_558;
  undefined4 local_54c;
  undefined8 *local_548;
  undefined1 local_530 [16];
  ostream aoStack_520 [376];
  uint *local_3a8;
  char *local_3a0;
  uint *local_398;
  char *local_390;
  uint *local_388;
  char *local_380;
  uint *local_378;
  char *local_370;
  undefined4 local_364;
  undefined8 *local_360;
  uint *local_358;
  char *local_350;
  uint *local_348;
  char *local_340;
  uint *local_338;
  char *local_330;
  uint *local_328;
  char *local_320;
  undefined *local_318;
  undefined1 *local_310;
  undefined8 *local_308;
  undefined *local_300;
  undefined1 *local_2f8;
  undefined8 *local_2f0;
  undefined *local_2e8;
  undefined1 *local_2e0;
  uint *local_2d8;
  char *local_2d0;
  uint *local_2c8;
  char *local_2c0;
  uint *local_2b8;
  char *local_2b0;
  uint *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  LogStringBuffer *local_290;
  char *local_288;
  undefined1 *local_280;
  LogStringBuffer *local_278;
  char *local_270;
  undefined1 *local_268;
  uint *local_260;
  char *local_258;
  uint *local_250;
  char *local_248;
  uint *local_240;
  char *local_238;
  uint *local_230;
  undefined1 *local_228;
  LogStringBuffer *local_220;
  uint *local_218;
  undefined1 *local_210;
  LogStringBuffer *local_208;
  uint *local_200;
  undefined1 *local_1f8;
  uint *local_1f0;
  char *local_1e8;
  uint *local_1e0;
  char *local_1d8;
  uint *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  LogStringBuffer *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  LogStringBuffer *local_1a0;
  char *local_198;
  undefined1 *local_190;
  uint *local_188;
  char *local_180;
  uint *local_178;
  char *local_170;
  uint *local_168;
  undefined1 *local_160;
  LogStringBuffer *local_158;
  uint *local_150;
  undefined1 *local_148;
  LogStringBuffer *local_140;
  uint *local_138;
  undefined1 *local_130;
  uint *local_128;
  char *local_120;
  uint *local_118;
  char *local_110;
  undefined1 *local_108;
  LogStringBuffer *local_100;
  char *local_f8;
  undefined1 *local_f0;
  LogStringBuffer *local_e8;
  uint *local_e0;
  char *local_d8;
  uint *local_d0;
  undefined1 *local_c8;
  LogStringBuffer *local_c0;
  uint *local_b8;
  undefined1 *local_b0;
  LogStringBuffer *local_a8;
  uint *local_a0;
  undefined1 *local_98;
  uint *local_90;
  char *local_88;
  undefined1 *local_80;
  LogStringBuffer *local_78;
  uint *local_70;
  undefined1 *local_68;
  LogStringBuffer *local_60;
  uint *local_58;
  undefined1 *local_50;
  char *local_48;
  undefined1 *local_40;
  LogStringBuffer *local_38;
  char *local_30;
  undefined1 *local_28;
  char *local_20;
  undefined1 *local_18;
  
  local_648 = in_RDI + 0x210;
  local_64c = *(uint *)(in_RDI + 0x230);
  local_5d8 = in_RDI + 0x248;
  local_5dc = local_64c >> 6;
  local_660 = in_RSI;
  local_668 = std::array<siamese::OriginalPacket,_64UL>::operator[]
                        ((array<siamese::OriginalPacket,_64UL> *)in_stack_fffffffffffff930,
                         (size_type)in_stack_fffffffffffff928);
  local_678[3] = (local_668->Buffer).Bytes;
  bVar2 = GrowingAlignedDataBuffer::GrowZeroPadded
                    (in_stack_fffffffffffff938,in_stack_fffffffffffff930,
                     (uint)((ulong)in_stack_fffffffffffff928 >> 0x20));
  if (bVar2) {
    (local_668->Buffer).Bytes = local_678[3];
    local_678[1] = 1;
    local_678[2] = 1;
    local_678[0] = local_668->Column;
    local_67c = 0;
    local_638 = (local_668->Buffer).Data + local_678[3];
    local_630 = &local_67c;
    uVar3 = (uint8_t)local_678[0];
    if (local_678[0] < 0x80) {
      *local_638 = uVar3;
      local_5a4 = 1;
    }
    else {
      bVar1 = (byte)(local_678[0] >> 8);
      if (local_678[0] < 0x4000) {
        *local_638 = uVar3;
        local_638[1] = bVar1 | 0x80;
        local_5a4 = 2;
      }
      else {
        *local_638 = uVar3;
        local_638[1] = bVar1;
        local_638[2] = (byte)(local_678[0] >> 0x10) | 0xc0;
        local_5a4 = 3;
      }
    }
    local_5b8 = 0;
    local_5c0 = local_638 + local_5a4;
    *local_5c0 = '\0';
    local_5b4 = 1;
    local_63c = local_5a4 + 1;
    *(uint8_t **)(local_660 + 2) = (local_668->Buffer).Data;
    *local_660 = local_678[3] + local_63c;
    local_5f8 = local_678;
    local_608 = local_678 + 2;
    local_618 = local_678 + 1;
    local_628 = &local_67c;
    local_5e8 = &Logger;
    local_5f0 = "Generated single recovery packet start=";
    local_600 = " ldpcCount=";
    local_610 = " sumCount=";
    local_620 = " row=";
    local_558 = &Logger;
    local_55c = 2;
    local_568 = "Generated single recovery packet start=";
    local_578 = " ldpcCount=";
    local_588 = " sumCount=";
    local_598 = " row=";
    this_00 = (OutputWorker *)&Logger;
    local_548 = &Logger;
    local_54c = 2;
    if (DAT_002b6400 < 3) {
      local_360 = &Logger;
      local_364 = 2;
      local_370 = "Generated single recovery packet start=";
      local_380 = " ldpcCount=";
      local_390 = " sumCount=";
      local_3a0 = " row=";
      local_5b0 = local_638;
      local_5a8 = local_678[0];
      local_5a0 = local_628;
      local_590 = local_618;
      local_580 = local_608;
      local_570 = local_5f8;
      local_3a8 = local_628;
      local_398 = local_618;
      local_388 = local_608;
      local_378 = local_5f8;
      logger::LogStringBuffer::LogStringBuffer
                ((LogStringBuffer *)in_stack_fffffffffffff930,in_stack_fffffffffffff928,Trace);
      local_318 = &DAT_002b6430;
      local_308 = &Logger;
      local_320 = local_370;
      local_328 = local_378;
      local_330 = local_380;
      local_338 = local_388;
      local_340 = local_390;
      local_348 = local_398;
      local_350 = local_3a0;
      local_358 = local_3a8;
      pLVar4 = (LogStringBuffer *)&Logger;
      local_2f0 = &Logger;
      local_310 = local_530;
      local_300 = local_318;
      local_2f8 = local_530;
      local_2e8 = local_318;
      local_2e0 = local_530;
      std::operator<<(aoStack_520,(string *)&DAT_002b6430);
      local_298 = local_310;
      local_2a0 = local_320;
      local_2a8 = local_328;
      local_2b0 = local_330;
      local_2b8 = local_338;
      local_2c0 = local_340;
      local_2c8 = local_348;
      local_2d0 = local_350;
      local_2d8 = local_358;
      local_280 = local_310;
      local_288 = local_320;
      local_268 = local_310;
      local_270 = local_320;
      buffer_00 = pLVar4;
      local_290 = pLVar4;
      local_278 = pLVar4;
      std::operator<<((ostream *)(local_310 + 0x10),local_320);
      local_228 = local_298;
      local_230 = local_2a8;
      local_238 = local_2b0;
      local_240 = local_2b8;
      local_248 = local_2c0;
      local_250 = local_2c8;
      local_258 = local_2d0;
      local_260 = local_2d8;
      local_210 = local_298;
      local_218 = local_2a8;
      local_1f8 = local_298;
      local_200 = local_2a8;
      local_220 = pLVar4;
      local_208 = pLVar4;
      std::ostream::operator<<((ostream *)(local_298 + 0x10),*local_2a8);
      local_1c0 = local_228;
      local_1c8 = local_238;
      local_1d0 = local_240;
      local_1d8 = local_248;
      local_1e0 = local_250;
      local_1e8 = local_258;
      local_1f0 = local_260;
      local_1a8 = local_228;
      local_1b0 = local_238;
      local_190 = local_228;
      local_198 = local_238;
      local_1b8 = pLVar4;
      local_1a0 = pLVar4;
      std::operator<<((ostream *)(local_228 + 0x10),local_238);
      local_160 = local_1c0;
      local_168 = local_1d0;
      local_170 = local_1d8;
      local_178 = local_1e0;
      local_180 = local_1e8;
      local_188 = local_1f0;
      local_148 = local_1c0;
      local_150 = local_1d0;
      local_130 = local_1c0;
      local_138 = local_1d0;
      local_158 = pLVar4;
      local_140 = pLVar4;
      std::ostream::operator<<((ostream *)(local_1c0 + 0x10),*local_1d0);
      local_108 = local_160;
      local_110 = local_170;
      local_118 = local_178;
      local_120 = local_180;
      local_128 = local_188;
      local_f0 = local_160;
      local_f8 = local_170;
      local_18 = local_160;
      local_20 = local_170;
      local_100 = pLVar4;
      local_e8 = pLVar4;
      std::operator<<((ostream *)(local_160 + 0x10),local_170);
      local_c8 = local_108;
      local_d0 = local_118;
      local_d8 = local_120;
      local_e0 = local_128;
      local_b0 = local_108;
      local_b8 = local_118;
      local_98 = local_108;
      local_a0 = local_118;
      local_c0 = pLVar4;
      local_a8 = pLVar4;
      std::ostream::operator<<((ostream *)(local_108 + 0x10),*local_118);
      local_80 = local_c8;
      local_88 = local_d8;
      local_90 = local_e0;
      local_40 = local_c8;
      local_48 = local_d8;
      local_28 = local_c8;
      local_30 = local_d8;
      local_78 = pLVar4;
      local_38 = pLVar4;
      std::operator<<((ostream *)(local_c8 + 0x10),local_d8);
      local_68 = local_80;
      local_70 = local_90;
      local_50 = local_80;
      local_58 = local_90;
      local_60 = pLVar4;
      std::ostream::operator<<((ostream *)(local_80 + 0x10),*local_90);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(this_00,buffer_00);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1e083c);
    }
    *(long *)(in_RDI + 0x1d8) = *(long *)(in_RDI + 0x1d8) + 1;
    *(ulong *)(in_RDI + 0x1e0) = (ulong)*local_660 + *(long *)(in_RDI + 0x1e0);
    local_650 = Siamese_Success;
  }
  else {
    *(undefined1 *)(in_RDI + 0x648) = 1;
    local_650 = Siamese_Disabled;
  }
  return local_650;
}

Assistant:

SiameseResult Encoder::GenerateSinglePacket(SiameseRecoveryPacket& packet)
{
    OriginalPacket* original     = Window.GetWindowElement(Window.FirstUnremovedElement);
    const unsigned originalBytes = original->Buffer.Bytes;

    // Note: This often does not actually reallocate or move since we overallocate
    if (!original->Buffer.GrowZeroPadded(&TheAllocator, originalBytes + kMaxRecoveryMetadataBytes))
    {
        Window.EmergencyDisabled = true;
        return Siamese_Disabled;
    }

    // Set bytes back to original
    original->Buffer.Bytes = originalBytes;

    // Serialize metadata into the last few bytes of the packet
    // Note: This saves an extra copy to move the data around
    RecoveryMetadata metadata;
    metadata.SumCount    = 1;
    metadata.LDPCCount   = 1;
    metadata.ColumnStart = original->Column;
    metadata.Row         = 0;

    const unsigned footerBytes = SerializeFooter_RecoveryMetadata(metadata, original->Buffer.Data + originalBytes);
    packet.Data      = original->Buffer.Data;
    packet.DataBytes = originalBytes + footerBytes;

    Logger.Info("Generated single recovery packet start=", metadata.ColumnStart, " ldpcCount=", metadata.LDPCCount, " sumCount=", metadata.SumCount, " row=", metadata.Row);

    Stats.Counts[SiameseEncoderStats_RecoveryCount]++;
    Stats.Counts[SiameseEncoderStats_RecoveryBytes] += packet.DataBytes;

    return Siamese_Success;
}